

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_IHDR(png_structrp png_ptr,png_uint_32 width,png_uint_32 height,int bit_depth,
                   int color_type,int compression_type,int filter_type,int interlace_type)

{
  byte bVar1;
  png_byte pVar2;
  ulong uVar3;
  char *error_message;
  png_byte local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  png_byte local_35;
  png_byte local_34;
  undefined1 local_33;
  png_byte local_32;
  png_byte local_31;
  
  switch(color_type) {
  case 0:
    if ((0x10 < (uint)bit_depth) || (pVar2 = '\x01', (0x10116U >> (bit_depth & 0x1fU) & 1) == 0)) {
      error_message = "Invalid bit depth for grayscale image";
      goto LAB_001250bd;
    }
    break;
  default:
    error_message = "Invalid image color type specified";
LAB_001250bd:
    png_error(png_ptr,error_message);
  case 2:
    pVar2 = '\x03';
    if ((bit_depth != 8) && (bit_depth != 0x10)) {
      error_message = "Invalid bit depth for RGB image";
      goto LAB_001250bd;
    }
    break;
  case 3:
    if ((7 < bit_depth - 1U) || (pVar2 = '\x01', (0x8bU >> (bit_depth - 1U & 0x1f) & 1) == 0)) {
      error_message = "Invalid bit depth for paletted image";
      goto LAB_001250bd;
    }
    break;
  case 4:
    pVar2 = '\x02';
    if ((bit_depth != 8) && (bit_depth != 0x10)) {
      error_message = "Invalid bit depth for grayscale+alpha image";
      goto LAB_001250bd;
    }
    break;
  case 6:
    pVar2 = '\x04';
    if ((bit_depth != 8) && (bit_depth != 0x10)) {
      error_message = "Invalid bit depth for RGBA image";
      goto LAB_001250bd;
    }
  }
  png_ptr->channels = pVar2;
  if (compression_type != 0) {
    png_warning(png_ptr,"Invalid compression type specified");
  }
  if (((png_ptr->mng_features_permitted & 4) == 0) || ((png_ptr->mode & 0x1000) != 0)) {
    if (filter_type != 0) goto LAB_00124f59;
  }
  else {
    if ((filter_type == 0) || (filter_type == 0x40 && (color_type & 0xfffffffbU) == 2))
    goto LAB_00124f6b;
LAB_00124f59:
    png_warning(png_ptr,"Invalid filter type specified");
  }
  filter_type = 0;
LAB_00124f6b:
  if (1 < (uint)interlace_type) {
    png_warning(png_ptr,"Invalid interlace type specified");
    interlace_type = 1;
  }
  local_35 = (png_byte)bit_depth;
  png_ptr->bit_depth = local_35;
  local_34 = (png_byte)color_type;
  png_ptr->color_type = local_34;
  local_31 = (png_byte)interlace_type;
  png_ptr->interlaced = local_31;
  local_32 = (png_byte)filter_type;
  png_ptr->filter_type = local_32;
  png_ptr->compression_type = '\0';
  png_ptr->width = width;
  png_ptr->height = height;
  bVar1 = png_ptr->channels * local_35;
  png_ptr->pixel_depth = bVar1;
  if (bVar1 < 8) {
    uVar3 = (ulong)bVar1 * (ulong)width + 7 >> 3;
  }
  else {
    uVar3 = (ulong)(bVar1 >> 3) * (ulong)width;
  }
  png_ptr->rowbytes = uVar3;
  png_ptr->usr_width = width;
  png_ptr->usr_bit_depth = local_35;
  png_ptr->usr_channels = png_ptr->channels;
  local_3d = (png_byte)(width >> 0x18);
  local_3c = (undefined1)(width >> 0x10);
  local_3b = (undefined1)(width >> 8);
  local_3a = (undefined1)width;
  local_39 = (undefined1)(height >> 0x18);
  local_38 = (undefined1)(height >> 0x10);
  local_37 = (undefined1)(height >> 8);
  local_36 = (undefined1)height;
  local_33 = 0;
  png_write_complete_chunk(png_ptr,0x49484452,&local_3d,0xd);
  if (png_ptr->do_filter == '\0') {
    pVar2 = '\b';
    if (png_ptr->color_type != '\x03') {
      pVar2 = (png_ptr->bit_depth < 8) * '\x10' + 0xf8;
    }
    png_ptr->do_filter = pVar2;
  }
  png_ptr->mode = 1;
  return;
}

Assistant:

void /* PRIVATE */
png_write_IHDR(png_structrp png_ptr, png_uint_32 width, png_uint_32 height,
    int bit_depth, int color_type, int compression_type, int filter_type,
    int interlace_type)
{
   png_byte buf[13]; /* Buffer to store the IHDR info */
   int is_invalid_depth;

   png_debug(1, "in png_write_IHDR");

   /* Check that we have valid input data from the application info */
   switch (color_type)
   {
      case PNG_COLOR_TYPE_GRAY:
         switch (bit_depth)
         {
            case 1:
            case 2:
            case 4:
            case 8:
#ifdef PNG_WRITE_16BIT_SUPPORTED
            case 16:
#endif
               png_ptr->channels = 1; break;

            default:
               png_error(png_ptr,
                   "Invalid bit depth for grayscale image");
         }
         break;

      case PNG_COLOR_TYPE_RGB:
         is_invalid_depth = (bit_depth != 8);
#ifdef PNG_WRITE_16BIT_SUPPORTED
         is_invalid_depth = (is_invalid_depth && bit_depth != 16);
#endif
         if (is_invalid_depth)
            png_error(png_ptr, "Invalid bit depth for RGB image");

         png_ptr->channels = 3;
         break;

      case PNG_COLOR_TYPE_PALETTE:
         switch (bit_depth)
         {
            case 1:
            case 2:
            case 4:
            case 8:
               png_ptr->channels = 1;
               break;

            default:
               png_error(png_ptr, "Invalid bit depth for paletted image");
         }
         break;

      case PNG_COLOR_TYPE_GRAY_ALPHA:
         is_invalid_depth = (bit_depth != 8);
#ifdef PNG_WRITE_16BIT_SUPPORTED
         is_invalid_depth = (is_invalid_depth && bit_depth != 16);
#endif
         if (is_invalid_depth)
            png_error(png_ptr, "Invalid bit depth for grayscale+alpha image");

         png_ptr->channels = 2;
         break;

      case PNG_COLOR_TYPE_RGB_ALPHA:
         is_invalid_depth = (bit_depth != 8);
#ifdef PNG_WRITE_16BIT_SUPPORTED
         is_invalid_depth = (is_invalid_depth && bit_depth != 16);
#endif
         if (is_invalid_depth)
            png_error(png_ptr, "Invalid bit depth for RGBA image");

         png_ptr->channels = 4;
         break;

      default:
         png_error(png_ptr, "Invalid image color type specified");
   }

   if (compression_type != PNG_COMPRESSION_TYPE_BASE)
   {
      png_warning(png_ptr, "Invalid compression type specified");
      compression_type = PNG_COMPRESSION_TYPE_BASE;
   }

   /* Write filter_method 64 (intrapixel differencing) only if
    * 1. Libpng was compiled with PNG_MNG_FEATURES_SUPPORTED and
    * 2. Libpng did not write a PNG signature (this filter_method is only
    *    used in PNG datastreams that are embedded in MNG datastreams) and
    * 3. The application called png_permit_mng_features with a mask that
    *    included PNG_FLAG_MNG_FILTER_64 and
    * 4. The filter_method is 64 and
    * 5. The color_type is RGB or RGBA
    */
   if (
#ifdef PNG_MNG_FEATURES_SUPPORTED
       !((png_ptr->mng_features_permitted & PNG_FLAG_MNG_FILTER_64) != 0 &&
       ((png_ptr->mode & PNG_HAVE_PNG_SIGNATURE) == 0) &&
       (color_type == PNG_COLOR_TYPE_RGB ||
        color_type == PNG_COLOR_TYPE_RGB_ALPHA) &&
       (filter_type == PNG_INTRAPIXEL_DIFFERENCING)) &&
#endif
       filter_type != PNG_FILTER_TYPE_BASE)
   {
      png_warning(png_ptr, "Invalid filter type specified");
      filter_type = PNG_FILTER_TYPE_BASE;
   }

#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   if (interlace_type != PNG_INTERLACE_NONE &&
       interlace_type != PNG_INTERLACE_ADAM7)
   {
      png_warning(png_ptr, "Invalid interlace type specified");
      interlace_type = PNG_INTERLACE_ADAM7;
   }
#else
   interlace_type=PNG_INTERLACE_NONE;
#endif

   /* Save the relevant information */
   png_ptr->bit_depth = (png_byte)bit_depth;
   png_ptr->color_type = (png_byte)color_type;
   png_ptr->interlaced = (png_byte)interlace_type;
#ifdef PNG_MNG_FEATURES_SUPPORTED
   png_ptr->filter_type = (png_byte)filter_type;
#endif
   png_ptr->compression_type = (png_byte)compression_type;
   png_ptr->width = width;
   png_ptr->height = height;

   png_ptr->pixel_depth = (png_byte)(bit_depth * png_ptr->channels);
   png_ptr->rowbytes = PNG_ROWBYTES(png_ptr->pixel_depth, width);
   /* Set the usr info, so any transformations can modify it */
   png_ptr->usr_width = png_ptr->width;
   png_ptr->usr_bit_depth = png_ptr->bit_depth;
   png_ptr->usr_channels = png_ptr->channels;

   /* Pack the header information into the buffer */
   png_save_uint_32(buf, width);
   png_save_uint_32(buf + 4, height);
   buf[8] = (png_byte)bit_depth;
   buf[9] = (png_byte)color_type;
   buf[10] = (png_byte)compression_type;
   buf[11] = (png_byte)filter_type;
   buf[12] = (png_byte)interlace_type;

   /* Write the chunk */
   png_write_complete_chunk(png_ptr, png_IHDR, buf, 13);

   if ((png_ptr->do_filter) == PNG_NO_FILTERS)
   {
      if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE ||
          png_ptr->bit_depth < 8)
         png_ptr->do_filter = PNG_FILTER_NONE;

      else
         png_ptr->do_filter = PNG_ALL_FILTERS;
   }

   png_ptr->mode = PNG_HAVE_IHDR; /* not READY_FOR_ZTXT */
}